

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resampler.cpp
# Opt level: O3

void __thiscall
cubeb_passthrough_resampler_fill_short_input_Test::TestBody
          (cubeb_passthrough_resampler_fill_short_input_Test *this)

{
  bool bVar1;
  stringstream *psVar2;
  long lVar3;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar9 [16];
  AssertionResult gtest_ar;
  long output_frame_count;
  long input_frame_count;
  long got;
  passthrough_resampler<float> resampler;
  float input [64];
  float output [64];
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_298;
  internal local_290 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_288;
  long local_280 [2];
  AssertHelper local_270;
  long local_268;
  passthrough_resampler<float> local_260;
  undefined8 local_218 [32];
  undefined1 local_118 [256];
  int iVar8;
  int iVar10;
  
  lVar3 = 0;
  passthrough_resampler<float>::passthrough_resampler
            (&local_260,(cubeb_stream *)0x0,passthrough_resampler_fill_short_input,(void *)0x0,2,
             0xac44);
  local_280[1] = 0x10;
  local_280[0] = 0x20;
  memset(local_218,0,0x100);
  memset(local_118,0,0x100);
  uVar5 = 0x100000000;
  uVar6 = 0x300000002;
  do {
    auVar7._0_8_ = uVar6 & 0xffffffff;
    iVar8 = (int)(uVar6 >> 0x20);
    auVar7._8_4_ = iVar8;
    auVar7._12_4_ = 0;
    iVar10 = (int)(uVar5 >> 0x20);
    auVar9._0_8_ = uVar5 & 0xffffffff;
    auVar9._8_4_ = iVar10;
    auVar9._12_4_ = 0;
    *(ulong *)((long)local_218 + lVar3 * 4) =
         CONCAT44((float)((SUB168(auVar9 | _DAT_001320c0,8) - DAT_001320c0._8_8_) * 0.01),
                  (float)((SUB168(auVar9 | _DAT_001320c0,0) - (double)DAT_001320c0) * 0.01));
    *(ulong *)((long)local_218 + lVar3 * 4 + 8) =
         CONCAT44((float)((SUB168(auVar7 | _DAT_001320c0,8) - DAT_001320c0._8_8_) * 0.01),
                  (float)((SUB168(auVar7 | _DAT_001320c0,0) - (double)DAT_001320c0) * 0.01));
    lVar3 = lVar3 + 4;
    uVar5 = CONCAT44(iVar10 + 4,(int)uVar5 + 4);
    uVar6 = CONCAT44(iVar8 + 4,(int)uVar6 + 4);
  } while (lVar3 != 0x20);
  local_268 = passthrough_resampler<float>::fill(&local_260,local_218,local_280 + 1,local_118,0x20);
  testing::internal::CmpHelperEQ<long,long>
            (local_290,"got","output_frame_count",&local_268,local_280);
  if (local_290[0] == (internal)0x0) {
    psVar2 = (stringstream *)operator_new(0x188);
    std::__cxx11::stringstream::stringstream(psVar2);
    *(undefined8 *)(psVar2 + *(long *)(*(long *)(psVar2 + 0x10) + -0x18) + 0x18) = 0x11;
    if (local_288.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_288.ptr_)->_M_dataplus)._M_p;
    }
    local_298.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar2;
    testing::internal::AssertHelper::AssertHelper
              (&local_270,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_resampler.cpp"
               ,0x3cd,pcVar4);
    testing::internal::AssertHelper::operator=(&local_270,(Message *)&local_298);
    testing::internal::AssertHelper::~AssertHelper(&local_270);
    if (((local_298.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
       (local_298.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_298.ptr_ + 8))();
    }
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_288,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_298.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (local_280[0] + -0x10);
    testing::internal::CmpHelperEQ<long,long>
              (local_290,"input_frame_count","output_frame_count - 16",local_280 + 1,
               (long *)&local_298);
    if (local_290[0] == (internal)0x0) {
      psVar2 = (stringstream *)operator_new(0x188);
      std::__cxx11::stringstream::stringstream(psVar2);
      *(undefined8 *)(psVar2 + *(long *)(*(long *)(psVar2 + 0x10) + -0x18) + 0x18) = 0x11;
      if (local_288.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         ) {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((local_288.ptr_)->_M_dataplus)._M_p;
      }
      local_298.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar2;
      testing::internal::AssertHelper::AssertHelper
                (&local_270,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_resampler.cpp"
                 ,0x3cf,pcVar4);
      testing::internal::AssertHelper::operator=(&local_270,(Message *)&local_298);
      testing::internal::AssertHelper::~AssertHelper(&local_270);
      if (((local_298.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
          (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
         (local_298.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_298.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_288,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_260.super_cubeb_resampler._vptr_cubeb_resampler = (_func_int **)&PTR_fill_00148000;
  if (local_260.internal_input_buffer.data_ != (float *)0x0) {
    operator_delete__(local_260.internal_input_buffer.data_);
  }
  return;
}

Assistant:

TEST(cubeb, passthrough_resampler_fill_short_input) {
  uint32_t channels = 2;
  uint32_t sample_rate = 44100;
  passthrough_resampler<float> resampler =
    passthrough_resampler<float>(nullptr, passthrough_resampler_fill_short_input,
                                 nullptr, channels, sample_rate);

  long input_frame_count = 16;
  long output_frame_count = 32;
  float input[64] = {};
  float output[64] = {};
  for (uint32_t i = 0; i < input_frame_count * channels; ++i) {
    input[i] = 0.01 * i;
  }
  long got = resampler.fill(input, &input_frame_count, output, output_frame_count);
  ASSERT_EQ(got, output_frame_count);
  // Input frames used are less than the output frames due to glitch.
  ASSERT_EQ(input_frame_count, output_frame_count - 16);
}